

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O0

char * booster::locale::conv::to_utf<wchar_t>(char *begin,char *end,locale *loc,method_type how)

{
  string *in_RDX;
  locale *in_RSI;
  char *in_RDI;
  info *in_stack_ffffffffffffff78;
  string local_48 [72];
  
  std::use_facet<booster::locale::info>(in_RSI);
  info::encoding_abi_cxx11_(in_stack_ffffffffffffff78);
  booster::locale::conv::to_utf<wchar_t>(in_RDI,(char *)in_RSI,in_RDX,(method_type)local_48);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

std::basic_string<CharType> to_utf(char const *begin,char const *end,std::locale const &loc,method_type how=default_method)
            {
                return to_utf<CharType>(begin,end,std::use_facet<info>(loc).encoding(),how);
            }